

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_jsonmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_JsonModelSerialiser::basicSaveLoadString(tst_JsonModelSerialiser *this)

{
  QAbstractItemModel *sourceModel;
  QAbstractItemModel *destinationModel;
  undefined8 *puVar1;
  int iVar2;
  JsonModelSerialiser serialiser;
  
  iVar2 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar1 = (undefined8 *)QTest::qData("sourceModel",iVar2);
  sourceModel = (QAbstractItemModel *)*puVar1;
  iVar2 = qMetaTypeId<QAbstractItemModel*>();
  puVar1 = (undefined8 *)QTest::qData("destinationModel",iVar2);
  destinationModel = (QAbstractItemModel *)*puVar1;
  JsonModelSerialiser::JsonModelSerialiser(&serialiser,(QObject *)0x0);
  tst_SerialiserCommon::saveLoadString
            (&this->super_tst_SerialiserCommon,(AbstractStringSerialiser *)&serialiser,sourceModel,
             destinationModel,true,true);
  QObject::deleteLater();
  AbstractStringSerialiser::~AbstractStringSerialiser((AbstractStringSerialiser *)&serialiser);
  return;
}

Assistant:

void tst_JsonModelSerialiser::basicSaveLoadString()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    JsonModelSerialiser serialiser;
    saveLoadString(&serialiser, sourceModel, destinationModel, true);
    destinationModel->deleteLater();
}